

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlFdRead(void *context,char *buffer,int len)

{
  int __fd;
  bool bVar1;
  uint uVar2;
  xmlParserErrors xVar3;
  ssize_t sVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  
  if (len < 1) {
    iVar6 = 0;
  }
  else {
    __fd = *context;
    iVar6 = 0;
    do {
      sVar4 = read(__fd,buffer,(ulong)(uint)len);
      uVar2 = (uint)sVar4;
      if ((int)uVar2 < 0) {
        if (0 < iVar6) {
          return iVar6;
        }
        piVar5 = __errno_location();
        xVar3 = xmlIOErr(*piVar5);
        return -xVar3;
      }
      if (uVar2 == 0) {
        return iVar6;
      }
      iVar6 = iVar6 + uVar2;
      buffer = buffer + (uVar2 & 0x7fffffff);
      uVar7 = len - uVar2;
      bVar1 = (int)uVar2 <= len;
      len = uVar7;
    } while (uVar7 != 0 && bVar1);
  }
  return iVar6;
}

Assistant:

static int
xmlFdRead(void *context, char *buffer, int len) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret = 0;
    int bytes;

    while (len > 0) {
        bytes = read(fd, buffer, len);
        if (bytes < 0) {
            /*
             * If we already got some bytes, return them without
             * raising an error.
             */
            if (ret > 0)
                break;
            return(-xmlIOErr(errno));
        }
        if (bytes == 0)
            break;
        ret += bytes;
        buffer += bytes;
        len -= bytes;
    }

    return(ret);
}